

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokens.cpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::Tokens::createWrappedToken
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Tokens *this,Parameters *parameters,TTL *ttl)

{
  Client *client;
  allocator<char> local_b1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  size_type local_a8;
  char local_a0 [8];
  undefined8 uStack_98;
  Path local_90;
  Url local_70;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  client = *(Client **)this;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"create",&local_b1);
  local_90.value_._M_dataplus._M_p = (pointer)&local_90.value_.field_2;
  if (local_b0 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0) {
    local_90.value_.field_2._8_8_ = uStack_98;
  }
  else {
    local_90.value_._M_dataplus._M_p = (pointer)local_b0;
  }
  local_90.value_._M_string_length = local_a8;
  local_a8 = 0;
  local_a0[0] = '\0';
  local_b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_a0;
  getUrl(&local_70,this,&local_90);
  local_50._8_8_ = 0;
  local_38 = std::
             _Function_handler<curl_slist_*(curl_slist_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/abedra[P]libvault/src/auth/Tokens.cpp:101:52)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<curl_slist_*(curl_slist_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/abedra[P]libvault/src/auth/Tokens.cpp:101:52)>
             ::_M_manager;
  local_50._M_unused._M_object = ttl;
  HttpConsumer::post(__return_storage_ptr__,client,&local_70,parameters,
                     (CurlHeaderCallback *)&local_50);
  std::_Function_base::~_Function_base((_Function_base *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string>
Tokens::createWrappedToken(const Parameters &parameters, const TTL &ttl) {
  return HttpConsumer::post(
      client_, getUrl(Path{"create"}), parameters, [&](curl_slist *chunk) {
        return curl_slist_append(chunk, ("X-Vault-Wrap-TTL: " + ttl).c_str());
      });
}